

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvrogencppTests.cc
# Opt level: O0

void checkRecord<testgen_r::RootRecord,testgen::RootRecord>(RootRecord *r1,RootRecord *r2)

{
  bool bVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  right_end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  right_begin;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_end;
  assertion_result *in_RSI;
  long in_RDI;
  char *pcVar2;
  undefined1 uVar4;
  undefined8 uVar3;
  char *in_stack_fffffffffffff4b0;
  char *in_stack_fffffffffffff4b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff4c0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff4c8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff4d0;
  const_string *in_stack_fffffffffffff4e8;
  const_string *msg;
  size_t in_stack_fffffffffffff4f0;
  const_string *in_stack_fffffffffffff4f8;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff500;
  equal_coll_impl *this;
  _bigrecord_r_Union__2__ *in_stack_fffffffffffff508;
  equal_coll_impl *this_00;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  left_begin;
  unsigned_long len;
  basic_cstring<const_char> local_838;
  undefined1 local_828 [40];
  const_string local_800;
  basic_cstring<const_char> local_7f0;
  basic_cstring<const_char> local_7e0;
  lazy_ostream local_7d0 [2];
  uchar *local_7b0;
  uchar *local_7a8;
  uchar *local_7a0;
  uchar *local_798;
  assertion_result local_788;
  basic_cstring<const_char> local_760;
  undefined1 local_750 [32];
  undefined1 local_730 [56];
  basic_cstring<const_char> local_6f8;
  basic_cstring<const_char> local_6e8;
  undefined1 local_6d8 [56];
  basic_cstring<const_char> local_6a0;
  basic_cstring<const_char> local_690;
  lazy_ostream local_680 [2];
  assertion_result local_658;
  equal_coll_impl local_640 [16];
  basic_cstring<const_char> local_630;
  basic_cstring<const_char> local_620;
  undefined1 local_610 [56];
  basic_cstring<const_char> local_5d8;
  basic_cstring<const_char> local_5c8;
  undefined1 local_5b8 [56];
  basic_cstring<const_char> local_580;
  basic_cstring<const_char> local_570;
  undefined1 local_560 [56];
  basic_cstring<const_char> local_528;
  basic_cstring<const_char> local_518;
  undefined1 local_508 [56];
  basic_cstring<const_char> local_4d0;
  basic_cstring<const_char> local_4c0;
  basic_cstring<const_char> local_4b0;
  lazy_ostream local_4a0 [5];
  assertion_result local_450;
  basic_cstring<const_char> local_428;
  undefined1 local_418 [32];
  undefined1 local_3f8 [56];
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  lazy_ostream local_390 [8];
  assertion_result local_310;
  basic_cstring<const_char> local_2e8;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [56];
  basic_cstring<const_char> local_280;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  lazy_ostream local_250 [2];
  assertion_result local_230;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  lazy_ostream local_1d8 [2];
  assertion_result local_1b8;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  undefined1 local_170 [56];
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  undefined1 local_118 [56];
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  undefined1 local_c0 [56];
  basic_cstring<const_char> local_88 [2];
  basic_cstring<const_char> local_68;
  undefined1 local_58 [56];
  basic_cstring<const_char> local_20;
  assertion_result *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    in_stack_fffffffffffff4b8 = "r2.mylong";
    in_stack_fffffffffffff4b0 = (char *)local_10;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_58,&local_68,0x68,1,2,local_8,"r1.mylong");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25d039);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    in_stack_fffffffffffff4b0 = (char *)&local_10->m_message;
    in_stack_fffffffffffff4b8 = "r2.nestedrecord.inval1";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_c0,&local_d0,0x69,1,2,local_8 + 0x58,"r1.nestedrecord.inval1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25d162);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    in_stack_fffffffffffff4b0 = (char *)&(local_10->m_message).pn;
    in_stack_fffffffffffff4b8 = "r2.nestedrecord.inval2";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_118,&local_128,0x6a,1,2,local_8 + 0x38,"r1.nestedrecord.inval2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25d28b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    in_stack_fffffffffffff4b0 = (char *)(local_10 + 2);
    in_stack_fffffffffffff4b8 = "r2.nestedrecord.inval3";
    pcVar2 = "r1.nestedrecord.inval3";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_170,&local_180,0x6b,1,2,local_8 + 0x60);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25d3b4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_fffffffffffff4b0,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)pcVar2);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff4b0,SUB81((ulong)pcVar2 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,"r1.mymap == r2.mymap",0x14);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,
               (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    pcVar2 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1b8,local_1d8,&local_1f8,0x6c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x25d500);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x25d50d);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar4 = (undefined1)((ulong)pcVar2 >> 0x38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    std::operator==(in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff4b0,(bool)uVar4);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,"r1.myarray == r2.myarray",0x18);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,
               (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    pcVar2 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_230,local_250,&local_270,0x6d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x25d65f);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x25d66c);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2d8 + 0x10),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    local_2d8._8_8_ =
         testgen_r::_bigrecord_r_Union__2__::idx((_bigrecord_r_Union__2__ *)(local_8 + 0x108));
    local_2d8._0_8_ =
         testgen::_bigrecord_Union__0__::idx((_bigrecord_Union__0__ *)&local_10[7].m_message.pn);
    in_stack_fffffffffffff4b8 = "r2.myunion.idx()";
    in_stack_fffffffffffff4b0 = local_2d8;
    pcVar2 = "r1.myunion.idx()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_2b8,local_2d8 + 0x10,0x6e,1,2,local_2d8 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25d7d7);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    testgen_r::_bigrecord_r_Union__2__::get_map_abi_cxx11_(in_stack_fffffffffffff508);
    testgen::_bigrecord_Union__0__::get_map_abi_cxx11_
              ((_bigrecord_Union__0__ *)in_stack_fffffffffffff508);
    std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_fffffffffffff4b0,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)pcVar2);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff4b0,SUB81((ulong)pcVar2 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a0,"r1.myunion.get_map() == r2.myunion.get_map()",0x2c);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,
               (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    pcVar2 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_310,local_390,&local_3b0,0x6f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x25d96a);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x25d977);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)0x25d984);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)0x25d991);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_418 + 0x10),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    local_418._8_8_ =
         testgen_r::_bigrecord_r_Union__3__::idx((_bigrecord_r_Union__3__ *)(local_8 + 0x118));
    local_418._0_8_ =
         testgen::_bigrecord_Union__1__::idx((_bigrecord_Union__1__ *)&local_10[8].m_message);
    in_stack_fffffffffffff4b8 = "r2.anotherunion.idx()";
    in_stack_fffffffffffff4b0 = local_418;
    uVar3 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_3f8,local_418 + 0x10,0x70,1,2,local_418 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25dafc);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar4 = (undefined1)((ulong)uVar3 >> 0x38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    testgen_r::_bigrecord_r_Union__3__::get_bytes
              ((_bigrecord_r_Union__3__ *)in_stack_fffffffffffff508);
    testgen::_bigrecord_Union__1__::get_bytes((_bigrecord_Union__1__ *)in_stack_fffffffffffff508);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff4d0,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff4c8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff4b0,(bool)uVar4);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b0,"r1.anotherunion.get_bytes() == r2.anotherunion.get_bytes()",0x3a);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,
               (basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    uVar3 = 0;
    boost::test_tools::tt_detail::report_assertion
              (&local_450,local_4a0,&local_4c0,0x71,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x25dc8f);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x25dc9c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffff4c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffff4c0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar2 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_518,pcVar2,0x72);
    in_stack_fffffffffffff4b0 = (char *)(local_10 + 9);
    in_stack_fffffffffffff4b8 = "r2.mybool";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_508,&local_518,0x72,1,2,local_8 + 0x128,"r1.mybool");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25dde8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    len = 0x72;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_528,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,len);
    in_stack_fffffffffffff4b0 = (char *)&local_10[9].m_message;
    in_stack_fffffffffffff4b8 = "r2.anothernested.inval1";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_560,&local_570,0x73,1,2,local_8 + 0x150,"r1.anothernested.inval1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25df17);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_580,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    in_stack_fffffffffffff4b0 = (char *)&local_10[9].m_message.pn;
    in_stack_fffffffffffff4b8 = "r2.anothernested.inval2";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_5b8,&local_5c8,0x74,1,2,local_8 + 0x130,"r1.anothernested.inval2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25e046);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    left_begin._M_current = (uchar *)boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    in_stack_fffffffffffff4b0 = (char *)(local_10 + 0xb);
    in_stack_fffffffffffff4b8 = "r2.anothernested.inval3";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_610,&local_620,0x75,1,2,local_8 + 0x158,"r1.anothernested.inval3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25e175);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_630,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    this_00 = local_640;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    right_end._M_current =
         boost::array<unsigned_char,_16UL>::begin((array<unsigned_char,_16UL> *)(local_8 + 400));
    right_begin._M_current =
         boost::array<unsigned_char,_16UL>::end((array<unsigned_char,_16UL> *)(local_8 + 400));
    left_end._M_current =
         boost::array<unsigned_char,_16UL>::begin
                   ((array<unsigned_char,_16UL> *)&local_10[0xb].m_message);
    boost::array<unsigned_char,_16UL>::end((array<unsigned_char,_16UL> *)&local_10[0xb].m_message);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)left_begin._M_current,left_end._M_current,right_begin._M_current,
               right_end._M_current,(uchar *)this_00);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    in_stack_fffffffffffff4b8 = "r1.myfixed.end()";
    in_stack_fffffffffffff4b0 = "r1.myfixed.begin()";
    boost::test_tools::tt_detail::report_assertion
              (&local_658,local_680,&local_690,0x77,CHECK,CHECK_EQUAL_COLL,4,"r1.myfixed.begin()",
               "r1.myfixed.end()","r2.myfixed.begin()","r2.myfixed.end()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25e331);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x25e33e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    in_stack_fffffffffffff4b0 = (char *)(local_10 + 0xc);
    in_stack_fffffffffffff4b8 = "r2.anotherint";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_6d8,&local_6e8,0x78,1,2,local_8 + 0x1a0,"r1.anotherint");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25e46d);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_750 + 0x10),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    local_750._8_8_ =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_8 + 0x1a8));
    local_750._0_8_ =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &local_10[0xc].m_message);
    in_stack_fffffffffffff4b8 = "r2.bytes.size()";
    in_stack_fffffffffffff4b0 = local_750;
    pcVar2 = "r1.bytes.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_730,local_750 + 0x10,0x79,1,2,local_750 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25e5ba);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_760,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
               in_stack_fffffffffffff4e8);
    local_798 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar2)
    ;
    local_7a0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar2)
    ;
    local_7a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar2)
    ;
    local_7b0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar2)
    ;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (this_00,left_begin,left_end,right_begin,right_end);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    in_stack_fffffffffffff4b8 = "r1.bytes.end()";
    in_stack_fffffffffffff4b0 = "r1.bytes.begin()";
    pcVar2 = (char *)0x4;
    boost::test_tools::tt_detail::report_assertion
              (&local_788,local_7d0,&local_7e0,0x7b,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25e771);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x25e77e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar2 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
    ;
    file = (const_string *)0x72;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/AvrogencppTests.cc"
               ,0x72);
    msg = &local_800;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,file,(size_t)pcVar2,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4b8,(char (*) [1])in_stack_fffffffffffff4b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_838,pcVar2,(unsigned_long)file);
    in_stack_fffffffffffff4b0 = (char *)&local_10[7].m_message;
    in_stack_fffffffffffff4b8 = "r2.myenum";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,testgen_r::ExampleEnum,testgen::ExampleEnum>
              (local_828,&local_838,0x7c,1,2,local_8 + 0x100,"r1.myenum");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x25e88f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  return;
}

Assistant:

void checkRecord(const T1& r1, const T2& r2)
{
    BOOST_CHECK_EQUAL(r1.mylong, r2.mylong);
    BOOST_CHECK_EQUAL(r1.nestedrecord.inval1, r2.nestedrecord.inval1);
    BOOST_CHECK_EQUAL(r1.nestedrecord.inval2, r2.nestedrecord.inval2);
    BOOST_CHECK_EQUAL(r1.nestedrecord.inval3, r2.nestedrecord.inval3);
    BOOST_CHECK(r1.mymap == r2.mymap);
    BOOST_CHECK(r1.myarray == r2.myarray);
    BOOST_CHECK_EQUAL(r1.myunion.idx(), r2.myunion.idx());
    BOOST_CHECK(r1.myunion.get_map() == r2.myunion.get_map());
    BOOST_CHECK_EQUAL(r1.anotherunion.idx(), r2.anotherunion.idx());
    BOOST_CHECK(r1.anotherunion.get_bytes() == r2.anotherunion.get_bytes());
    BOOST_CHECK_EQUAL(r1.mybool, r2.mybool);
    BOOST_CHECK_EQUAL(r1.anothernested.inval1, r2.anothernested.inval1);
    BOOST_CHECK_EQUAL(r1.anothernested.inval2, r2.anothernested.inval2);
    BOOST_CHECK_EQUAL(r1.anothernested.inval3, r2.anothernested.inval3);
    BOOST_CHECK_EQUAL_COLLECTIONS(r1.myfixed.begin(), r1.myfixed.end(),
        r2.myfixed.begin(), r2.myfixed.end());
    BOOST_CHECK_EQUAL(r1.anotherint, r2.anotherint);
    BOOST_CHECK_EQUAL(r1.bytes.size(), r2.bytes.size());
    BOOST_CHECK_EQUAL_COLLECTIONS(r1.bytes.begin(), r1.bytes.end(),
        r2.bytes.begin(), r2.bytes.end());
    BOOST_CHECK_EQUAL(r1.myenum, r2.myenum);
}